

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> __thiscall
slang::parsing::Parser::parseBlockItems
          (Parser *this,TokenKind endKind,Token *end,bool inConstructor)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  SourceLocation location;
  Diagnostic *pDVar5;
  SourceLocation SVar6;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  byte bVar7;
  TokenKind kind;
  Token TVar8;
  AttrList AVar9;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> sVar10;
  SyntaxNode *newNode;
  SmallVector<slang::syntax::SyntaxNode_*,_16UL> buffer;
  PortDeclarationSyntax *local_f8;
  undefined4 local_ec;
  ulong local_e8;
  Token local_e0;
  Token *local_d0;
  SmallVectorBase<slang::syntax::SyntaxNode_*> local_c8 [4];
  
  local_ec = (undefined4)CONCAT71(in_register_00000009,inConstructor);
  local_c8[0].data_ = (pointer)local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 0x10;
  local_d0 = end;
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  uVar4 = TVar8._0_8_;
  local_e8 = 0;
  bVar2 = false;
  bVar7 = 0;
  do {
    kind = (TokenKind)uVar4;
    bVar3 = slang::syntax::SyntaxFacts::isEndKeyword(kind);
    if (((bVar3) || (kind == endKind)) || (kind == EndOfFile)) {
      if (endKind == JoinKeyword) {
        if ((ushort)(kind - JoinKeyword) < 3) {
          TVar8 = ParserBase::consume(&this->super_ParserBase);
        }
        else {
          TVar8 = ParserBase::expect(&this->super_ParserBase,JoinKeyword);
        }
      }
      else {
        TVar8 = ParserBase::expect(&this->super_ParserBase,endKind);
      }
      *local_d0 = TVar8;
      sVar10._M_ptr._0_4_ =
           SmallVectorBase<slang::syntax::SyntaxNode_*>::copy
                     (local_c8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                      (EVP_PKEY_CTX *)TVar8.info);
      sVar10._M_ptr._4_4_ = extraout_var;
      if (local_c8[0].data_ != (pointer)local_c8[0].firstElement) {
        operator_delete(local_c8[0].data_);
      }
      sVar10._M_extent._M_extent_value = extraout_RDX._M_extent_value;
      return sVar10;
    }
    local_e0 = ParserBase::peek(&this->super_ParserBase);
    location = Token::location(&local_e0);
    local_f8 = (PortDeclarationSyntax *)0x0;
    bVar3 = isPortDeclaration(this,true);
    if (bVar3) {
      AVar9 = parseAttributes(this);
      local_f8 = parsePortDeclaration(this,AVar9);
LAB_0020a737:
      bVar3 = false;
    }
    else {
      bVar3 = isVariableDeclaration(this);
      if (bVar3) {
        AVar9 = parseAttributes(this);
        local_f8 = (PortDeclarationSyntax *)parseVariableDeclaration(this,AVar9);
        goto LAB_0020a737;
      }
      bVar3 = slang::syntax::SyntaxFacts::isPossibleStatement(kind);
      if (!bVar3) {
        ParserBase::skipToken
                  (&this->super_ParserBase,
                   (optional<slang::DiagCode>)((uint6)(~bVar7 & 1) << 0x20 | 0x510005));
        bVar7 = 1;
        goto LAB_0020a737;
      }
      local_f8 = (PortDeclarationSyntax *)
                 parseStatement(this,true,(bool)((bVar2 ^ 1U) & (byte)local_ec));
      if (((local_f8->super_MemberSyntax).super_SyntaxNode.kind == EmptyStatement) &&
         (((ulong)(local_f8->declarators).super_SyntaxListBase._vptr_SyntaxListBase & 0x10000) != 0)
         ) {
        local_e0 = ParserBase::peek(&this->super_ParserBase);
        SVar6 = Token::location(&local_e0);
        if (location != SVar6) goto LAB_0020a837;
        bVar3 = true;
        ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
        bVar2 = true;
      }
      else {
LAB_0020a837:
        bVar3 = true;
        bVar2 = true;
      }
    }
    if (local_f8 != (PortDeclarationSyntax *)0x0) {
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (local_f8->super_MemberSyntax).super_SyntaxNode.previewNode = pSVar1;
      SmallVectorBase<slang::syntax::SyntaxNode*>::emplace_back<slang::syntax::SyntaxNode*const&>
                ((SmallVectorBase<slang::syntax::SyntaxNode*> *)local_c8,(SyntaxNode **)&local_f8);
      if ((!bVar3 && (local_e8 & 1) == 0) && (bVar2)) {
        pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x190005,location);
        local_e8 = CONCAT71((int7)((ulong)pDVar5 >> 8),1);
      }
      bVar7 = 0;
    }
    TVar8 = ParserBase::peek(&this->super_ParserBase);
    uVar4 = TVar8._0_8_;
  } while( true );
}

Assistant:

std::span<SyntaxNode*> Parser::parseBlockItems(TokenKind endKind, Token& end, bool inConstructor) {
    SmallVector<SyntaxNode*, 16> buffer;
    auto kind = peek().kind;
    bool errored = false;
    bool sawStatement = false;
    bool erroredAboutDecls = false;

    while (!isEndKeyword(kind) && kind != endKind && kind != TokenKind::EndOfFile) {
        SourceLocation loc = peek().location();
        SyntaxNode* newNode = nullptr;
        bool isStmt = false;

        if (isPortDeclaration(/* inStatement */ true)) {
            newNode = &parsePortDeclaration(parseAttributes());
        }
        else if (isVariableDeclaration()) {
            newNode = &parseVariableDeclaration(parseAttributes());
        }
        else if (isPossibleStatement(kind)) {
            newNode = &parseStatement(/* allowEmpty */ true,
                                      /* allowSuperNew */ inConstructor && !sawStatement);
            if (newNode->kind == SyntaxKind::EmptyStatement &&
                newNode->as<EmptyStatementSyntax>().semicolon.isMissing() &&
                loc == peek().location()) {
                skipToken(std::nullopt);
            }
            isStmt = true;
            sawStatement = true;
        }
        else {
            skipToken(errored ? std::nullopt : std::make_optional(diag::ExpectedStatement));
            errored = true;
        }

        if (newNode) {
            newNode->previewNode = std::exchange(previewNode, nullptr);
            buffer.push_back(newNode);
            errored = false;

            if (!erroredAboutDecls && !isStmt && sawStatement) {
                addDiag(diag::DeclarationsAtStart, loc);
                erroredAboutDecls = true;
            }
        }
        kind = peek().kind;
    }

    // parallel blocks can end in one of three join keywords
    if (endKind == TokenKind::JoinKeyword) {
        switch (kind) {
            case TokenKind::JoinKeyword:
            case TokenKind::JoinAnyKeyword:
            case TokenKind::JoinNoneKeyword:
                end = consume();
                break;
            default:
                end = expect(endKind);
                break;
        }
    }
    else {
        end = expect(endKind);
    }

    return buffer.copy(alloc);
}